

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaFxch.c
# Opt level: O3

void Fxch_ManUpdate(Fxch_Man_t *p,int iDiv)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  word *pwVar14;
  Vec_Int_t *pVVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  int *piVar19;
  long lVar20;
  int *piVar21;
  long lVar22;
  int i;
  long lVar23;
  long lVar24;
  ulong uVar25;
  int *piVar26;
  ulong uVar27;
  int *piVar28;
  Vec_Int_t *pVVar29;
  uint local_58;
  uint local_50;
  
  uVar9 = Gia_ManRandom(0);
  Vec_IntPush(&p->vRands,uVar9 & 0x3ffffff);
  uVar9 = Gia_ManRandom(0);
  Vec_IntPush(&p->vRands,uVar9 & 0x3ffffff);
  if (-1 < iDiv) {
    pVVar15 = p->vHash->vObjs;
    uVar16 = iDiv * 4;
    uVar9 = pVVar15->nSize;
    if (uVar9 != uVar16 && SBORROW4(uVar9,uVar16) == (int)(uVar9 + iDiv * -4) < 0) {
      piVar3 = pVVar15->pArray;
      uVar9 = piVar3[uVar16];
      uVar27 = (ulong)(int)uVar9;
      if (-1 < (long)uVar27) {
        uVar16 = piVar3[(ulong)uVar16 + 1];
        uVar25 = (ulong)uVar16;
        if ((-1 < (int)uVar16) && ((int)uVar9 < (int)uVar16)) {
          uVar11 = (p->vDivs).nSize;
          if (uVar11 == (p->vDivs).nCap) {
            if ((int)uVar11 < 0x10) {
              pwVar14 = (p->vDivs).pArray;
              if (pwVar14 == (word *)0x0) {
                pwVar14 = (word *)malloc(0x80);
              }
              else {
                pwVar14 = (word *)realloc(pwVar14,0x80);
              }
              (p->vDivs).pArray = pwVar14;
              if (pwVar14 == (word *)0x0) {
LAB_0035b914:
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                              ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
              }
              (p->vDivs).nCap = 0x10;
            }
            else {
              pwVar14 = (p->vDivs).pArray;
              if (pwVar14 == (word *)0x0) {
                pwVar14 = (word *)malloc((ulong)uVar11 << 4);
              }
              else {
                pwVar14 = (word *)realloc(pwVar14,(ulong)uVar11 << 4);
              }
              (p->vDivs).pArray = pwVar14;
              if (pwVar14 == (word *)0x0) goto LAB_0035b914;
              (p->vDivs).nCap = uVar11 * 2;
            }
          }
          else {
            pwVar14 = (p->vDivs).pArray;
          }
          iVar12 = (p->vDivs).nSize;
          (p->vDivs).nSize = iVar12 + 1;
          pwVar14[iVar12] = uVar25 << 0x20 | uVar27;
          uVar11 = (p->vLits).nSize;
          if (((int)uVar9 < (int)uVar11) && (uVar16 < uVar11)) {
            pVVar15 = (p->vLits).pArray;
            uVar11 = pVVar15[uVar27].nSize;
            if ((int)uVar11 < 1) {
              uVar10 = 0;
            }
            else {
              piVar3 = pVVar15[uVar27].pArray;
              lVar22 = 0;
              uVar10 = 0;
              do {
                iVar12 = piVar3[lVar22];
                if (((long)iVar12 < 0) || ((p->vCubes).nSize <= iVar12)) goto LAB_0035b7a0;
                if (0 < (p->vCubes).pArray[iVar12].nSize) {
                  if (((int)uVar10 < 0) || (uVar11 <= uVar10)) goto LAB_0035b781;
                  uVar17 = (ulong)uVar10;
                  uVar10 = uVar10 + 1;
                  piVar3[uVar17] = iVar12;
                  uVar11 = pVVar15[uVar27].nSize;
                }
                lVar22 = lVar22 + 1;
              } while (lVar22 < (int)uVar11);
            }
            if ((int)uVar10 <= (int)uVar11) {
              pVVar15[uVar27].nSize = uVar10;
              uVar11 = pVVar15[uVar25].nSize;
              if ((int)uVar11 < 1) {
                uVar10 = 0;
              }
              else {
                piVar3 = pVVar15[uVar25].pArray;
                lVar22 = 0;
                uVar10 = 0;
                do {
                  iVar12 = piVar3[lVar22];
                  if (((long)iVar12 < 0) || ((p->vCubes).nSize <= iVar12)) goto LAB_0035b7a0;
                  if (0 < (p->vCubes).pArray[iVar12].nSize) {
                    if (((int)uVar10 < 0) || (uVar11 <= uVar10)) goto LAB_0035b781;
                    uVar17 = (ulong)uVar10;
                    uVar10 = uVar10 + 1;
                    piVar3[uVar17] = iVar12;
                    uVar11 = pVVar15[uVar25].nSize;
                  }
                  lVar22 = lVar22 + 1;
                } while (lVar22 < (int)uVar11);
              }
              if ((int)uVar10 <= (int)uVar11) {
                pVVar15[uVar25].nSize = uVar10;
                piVar19 = pVVar15[uVar27].pArray;
                piVar21 = pVVar15[uVar25].pArray;
                iVar12 = pVVar15[uVar27].nSize;
                piVar3 = piVar19 + iVar12;
                piVar1 = piVar21 + (int)uVar10;
                (p->vCubesS).nSize = 0;
                piVar26 = piVar19;
                piVar28 = piVar21;
                if ((0 < (int)uVar10) && (0 < iVar12)) {
                  do {
                    iVar12 = *piVar26;
                    iVar13 = *piVar21;
                    if (iVar12 == iVar13) {
                      Vec_IntPush(&p->vCubesS,iVar12);
                      piVar26 = piVar26 + 1;
                      piVar21 = piVar21 + 1;
                    }
                    else if (iVar12 < iVar13) {
                      piVar26 = piVar26 + 1;
                      *piVar19 = iVar12;
                      piVar19 = piVar19 + 1;
                    }
                    else {
                      piVar21 = piVar21 + 1;
                      *piVar28 = iVar13;
                      piVar28 = piVar28 + 1;
                    }
                  } while ((piVar26 < piVar3) && (piVar21 < piVar1));
                }
                for (; piVar26 < piVar3; piVar26 = piVar26 + 1) {
                  *piVar19 = *piVar26;
                  piVar19 = piVar19 + 1;
                }
                for (; piVar21 < piVar1; piVar21 = piVar21 + 1) {
                  *piVar28 = *piVar21;
                  piVar28 = piVar28 + 1;
                }
                iVar12 = (int)((ulong)((long)piVar19 - (long)pVVar15[uVar27].pArray) >> 2);
                if (iVar12 <= pVVar15[uVar27].nSize) {
                  pVVar15[uVar27].nSize = iVar12;
                  iVar12 = (int)((ulong)((long)piVar28 - (long)pVVar15[uVar25].pArray) >> 2);
                  if (iVar12 <= pVVar15[uVar25].nSize) {
                    pVVar15[uVar25].nSize = iVar12;
                    iVar12 = (p->vCubesS).nSize;
                    if (iVar12 < 1) {
                      uVar11 = 0;
                    }
                    else {
                      piVar3 = (p->vCubesS).pArray;
                      lVar22 = 0;
                      uVar11 = 0;
                      do {
                        uVar10 = piVar3[lVar22];
                        lVar23 = (long)(int)uVar10;
                        if ((lVar23 < 0) || ((p->vCubes).nSize <= (int)uVar10)) goto LAB_0035b7a0;
                        pVVar15 = (p->vCubes).pArray;
                        lVar24 = (long)pVVar15[lVar23].nSize;
                        if (0 < lVar24) {
                          lVar20 = 0;
                          bVar6 = false;
                          bVar8 = false;
                          do {
                            uVar18 = pVVar15[lVar23].pArray[lVar20];
                            bVar7 = bVar8;
                            if (uVar18 == uVar16) {
                              bVar7 = true;
                            }
                            if (uVar18 == uVar9) {
                              bVar6 = true;
                              bVar7 = bVar8;
                            }
                            lVar20 = lVar20 + 1;
                            bVar8 = bVar7;
                          } while (lVar24 != lVar20);
                          if ((bVar6) && (bVar7)) {
                            if (0xffffff < uVar10) {
                              __assert_fail("!(iCube >> 24) && !(iLit >> 8)",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/pla.h"
                                            ,0x5d,"int Pla_CubeHandle(int, int)");
                            }
                            if (((int)uVar11 < 0) || (iVar12 <= (int)uVar11)) {
LAB_0035b781:
                              __assert_fail("i >= 0 && i < p->nSize",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                            }
                            uVar27 = (ulong)uVar11;
                            uVar11 = uVar11 + 1;
                            piVar3[uVar27] = uVar10 << 8 | 0xff;
                            iVar12 = (p->vCubesS).nSize;
                          }
                        }
                        lVar22 = lVar22 + 1;
                      } while (lVar22 < iVar12);
                    }
                    if ((int)uVar11 <= iVar12) {
                      (p->vCubesS).nSize = uVar11;
                      if (iDiv < (p->vPairs).nSize) {
                        pVVar15 = (p->vPairs).pArray;
                        local_58 = uVar9 ^ 1;
                        local_50 = uVar16 ^ 1;
                        (p->vCubesD).nSize = 0;
                        if (1 < pVVar15[(uint)iDiv].nSize) {
                          lVar22 = 1;
                          do {
                            uVar11 = pVVar15[(uint)iDiv].pArray[lVar22 + -1];
                            uVar10 = pVVar15[(uint)iDiv].pArray[lVar22];
                            iVar12 = Fxch_TabCompare(p,uVar11,uVar10);
                            if (iVar12 != 0) {
                              uVar18 = (int)uVar11 >> 8;
                              if (((int)uVar18 < 0) ||
                                 (uVar2 = (p->vCubes).nSize, (int)uVar2 <= (int)uVar18))
                              goto LAB_0035b7a0;
                              pVVar4 = (p->vCubes).pArray;
                              if (pVVar4[uVar18].nSize <= (int)(uVar11 & 0xff)) goto LAB_0035b7bf;
                              if (pVVar4[uVar18].pArray[uVar11 & 0xff] == local_58) {
                                uVar18 = (int)uVar10 >> 8;
                                if (((int)uVar18 < 0) || (uVar2 <= uVar18)) goto LAB_0035b7a0;
                                if (pVVar4[uVar18].nSize <= (int)(uVar10 & 0xff)) goto LAB_0035b7bf;
                                if (pVVar4[uVar18].pArray[uVar10 & 0xff] == local_50) {
                                  Vec_IntPush(&p->vCubesD,uVar11);
                                  Vec_IntPush(&p->vCubesD,uVar10);
                                }
                              }
                            }
                            lVar22 = lVar22 + 2;
                          } while ((int)lVar22 < pVVar15[(uint)iDiv].nSize);
                        }
                        pVVar15[(uint)iDiv].nSize = 0;
                        uVar11 = (p->vCubesD).nSize;
                        if ((uVar11 & 1) != 0) {
                          __assert_fail("Vec_IntSize(&p->vCubesD) % 2 == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                                        ,0x28a,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
                        }
                        if (3 < (int)uVar11) {
                          qsort((p->vCubesD).pArray,(ulong)(uVar11 >> 1),8,Vec_IntSortCompare1);
                          uVar10 = (p->vCubesD).nSize;
                          uVar27 = (ulong)uVar10;
                          uVar11 = 2;
                          if (3 < (int)uVar10) {
                            piVar3 = (p->vCubesD).pArray;
                            iVar12 = 1;
                            lVar22 = 1;
                            do {
                              iVar13 = piVar3[lVar22 * 2 + 1];
                              if ((piVar3[lVar22 * 2] != piVar3[lVar22 * 2 + -2]) ||
                                 (iVar13 != piVar3[lVar22 * 2 + -1])) {
                                piVar3[iVar12 * 2] = piVar3[lVar22 * 2];
                                piVar3[iVar12 * 2 + 1] = iVar13;
                                iVar12 = iVar12 + 1;
                                uVar27 = (ulong)(uint)(p->vCubesD).nSize;
                              }
                              lVar22 = lVar22 + 1;
                            } while (lVar22 < (int)(uVar27 >> 0x1f) + (int)uVar27 >> 1);
                            uVar11 = iVar12 * 2;
                          }
                          (p->vCubesD).nSize = uVar11;
                        }
                        if ((uVar11 & 1) != 0) {
                          __assert_fail("Vec_IntSize(&p->vCubesD) % 2 == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                                        ,0x28c,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
                        }
                        iVar12 = (p->vCubesS).nSize;
                        if (0 < iVar12) {
                          lVar22 = 0;
                          do {
                            Fxch_TabSingleDivisors(p,(p->vCubesS).pArray[lVar22] >> 8,0);
                            lVar22 = lVar22 + 1;
                            iVar12 = (p->vCubesS).nSize;
                          } while (lVar22 < iVar12);
                          uVar11 = (p->vCubesD).nSize;
                        }
                        if (1 < (int)uVar11) {
                          lVar22 = 1;
                          do {
                            piVar3 = (p->vCubesD).pArray;
                            iVar12 = piVar3[lVar22];
                            Fxch_TabSingleDivisors(p,piVar3[lVar22 + -1] >> 8,0);
                            Fxch_TabSingleDivisors(p,iVar12 >> 8,0);
                            uVar11 = (p->vCubesD).nSize;
                            lVar22 = lVar22 + 2;
                          } while ((int)lVar22 < (int)uVar11);
                          iVar12 = (p->vCubesS).nSize;
                        }
                        if (0 < iVar12) {
                          lVar22 = 0;
                          do {
                            Fxch_TabDoubleDivisors(p,(p->vCubesS).pArray[lVar22] >> 8,0);
                            lVar22 = lVar22 + 1;
                          } while (lVar22 < (p->vCubesS).nSize);
                          uVar11 = (p->vCubesD).nSize;
                        }
                        if (1 < (int)uVar11) {
                          lVar22 = 1;
                          do {
                            piVar3 = (p->vCubesD).pArray;
                            iVar12 = piVar3[lVar22];
                            Fxch_TabDoubleDivisors(p,piVar3[lVar22 + -1] >> 8,0);
                            Fxch_TabDoubleDivisors(p,iVar12 >> 8,0);
                            lVar22 = lVar22 + 2;
                          } while ((int)lVar22 < (p->vCubesD).nSize);
                        }
                        p->nLits = p->nLits + 2;
                        iVar12 = (p->vLits).nSize;
                        Vec_WecPushLevel(&p->vLits);
                        pVVar15 = Vec_WecPushLevel(&p->vLits);
                        lVar22 = (long)(p->vLits).nSize;
                        if (1 < lVar22) {
                          pVVar4 = (p->vLits).pArray;
                          if (0 < (p->vCubesS).nSize) {
                            lVar23 = 0;
                            do {
                              uVar11 = (p->vCubesS).pArray[lVar23] >> 8;
                              if (((int)uVar11 < 0) || ((p->vCubes).nSize <= (int)uVar11))
                              goto LAB_0035b7a0;
                              pVVar29 = (p->vCubes).pArray;
                              pVVar5 = pVVar29 + uVar11;
                              uVar10 = pVVar29[uVar11].nSize;
                              if ((int)uVar10 < 1) {
                                uVar18 = 0;
                              }
                              else {
                                piVar3 = pVVar5->pArray;
                                lVar24 = 0;
                                uVar18 = 0;
                                do {
                                  uVar2 = piVar3[lVar24];
                                  if ((uVar2 != uVar9) && (uVar2 != uVar16)) {
                                    if (((int)uVar18 < 0) || (uVar10 <= uVar18)) goto LAB_0035b781;
                                    uVar27 = (ulong)uVar18;
                                    uVar18 = uVar18 + 1;
                                    piVar3[uVar27] = uVar2;
                                    uVar10 = pVVar5->nSize;
                                  }
                                  lVar24 = lVar24 + 1;
                                } while (lVar24 < (int)uVar10);
                              }
                              if (uVar10 != uVar18 + 2) {
                                __assert_fail("Vec_IntSize(p) == k + 2",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                                              ,0x133,
                                              "void Fxch_CompressLiterals(Vec_Int_t *, int, int)");
                              }
                              pVVar5->nSize = uVar18;
                              Vec_IntPush(pVVar4 + lVar22 + -2,uVar11);
                              if (iVar12 < -1) goto LAB_0035b7de;
                              Vec_IntPush(pVVar5,(iVar12 / 2) * 2);
                              p->nLits = p->nLits + -1;
                              lVar23 = lVar23 + 1;
                            } while (lVar23 < (p->vCubesS).nSize);
                          }
                          if (1 < (p->vCubesD).nSize) {
                            lVar23 = 0;
                            do {
                              piVar3 = (p->vCubesD).pArray;
                              uVar9 = piVar3[lVar23];
                              uVar16 = (int)uVar9 >> 8;
                              if (((int)uVar16 < 0) ||
                                 (uVar11 = (p->vCubes).nSize, (int)uVar11 <= (int)uVar16))
                              goto LAB_0035b7a0;
                              uVar10 = piVar3[lVar23 + 1];
                              uVar18 = (int)uVar10 >> 8;
                              if (((int)uVar18 < 0) || (uVar11 <= uVar18)) goto LAB_0035b7a0;
                              pVVar5 = (p->vCubes).pArray;
                              pVVar29 = pVVar5 + uVar16;
                              uVar9 = uVar9 & 0xff;
                              uVar11 = pVVar29->nSize;
                              if ((int)uVar11 <= (int)uVar9) {
LAB_0035b7bf:
                                __assert_fail("i >= 0 && i < p->nSize",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                              }
                              piVar3 = pVVar29->pArray;
                              if (piVar3[uVar9] != local_58) {
                                __assert_fail("Vec_IntEntry(vCube1, Pla_CubeLit(hCube1)) == Abc_LitNot(Lit0)"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                                              ,0x2c8,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
                              }
                              uVar10 = uVar10 & 0xff;
                              if (pVVar5[uVar18].nSize <= (int)uVar10) goto LAB_0035b7bf;
                              if (pVVar5[uVar18].pArray[uVar10] != local_50) {
                                __assert_fail("Vec_IntEntry(vCube2, Pla_CubeLit(hCube2)) == Abc_LitNot(Lit1)"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                                              ,0x2c9,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
                              }
                              uVar27 = 0;
                              uVar10 = 0;
                              do {
                                if (uVar9 != uVar27) {
                                  if (((int)uVar10 < 0) || (uVar11 <= uVar10)) goto LAB_0035b781;
                                  uVar25 = (ulong)uVar10;
                                  uVar10 = uVar10 + 1;
                                  piVar3[uVar25] = piVar3[uVar27];
                                  uVar11 = pVVar29->nSize;
                                }
                                uVar27 = uVar27 + 1;
                              } while ((long)uVar27 < (long)(int)uVar11);
                              if ((int)uVar11 < (int)uVar10) goto LAB_0035b7fd;
                              pVVar29->nSize = uVar10;
                              Vec_IntPush(pVVar15,uVar16);
                              if (iVar12 < -1) {
LAB_0035b7de:
                                __assert_fail("Var >= 0 && !(c >> 1)",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                                              ,0x10b,"int Abc_Var2Lit(int, int)");
                              }
                              Vec_IntPush(pVVar29,(iVar12 / 2) * 2 + 1);
                              p->nLits = p->nLits - pVVar5[uVar18].nSize;
                              pVVar5[uVar18].nSize = 0;
                              lVar23 = lVar23 + 2;
                            } while ((int)((uint)lVar23 | 1) < (p->vCubesD).nSize);
                          }
                          qsort(pVVar15->pArray,(long)pVVar15->nSize,4,Vec_IntSortCompare1);
                          qsort(pVVar4[lVar22 + -2].pArray,(long)pVVar4[lVar22 + -2].nSize,4,
                                Vec_IntSortCompare1);
                          iVar12 = (p->vCubesS).nSize;
                          if (0 < iVar12) {
                            lVar22 = 0;
                            do {
                              Fxch_TabSingleDivisors(p,(p->vCubesS).pArray[lVar22] >> 8,1);
                              lVar22 = lVar22 + 1;
                              iVar12 = (p->vCubesS).nSize;
                            } while (lVar22 < iVar12);
                          }
                          iVar13 = (p->vCubesD).nSize;
                          if (1 < iVar13) {
                            lVar22 = 0;
                            do {
                              Fxch_TabSingleDivisors(p,(p->vCubesD).pArray[lVar22] >> 8,1);
                              iVar13 = (p->vCubesD).nSize;
                              iVar12 = (int)lVar22;
                              lVar22 = lVar22 + 2;
                            } while (iVar12 + 3 < iVar13);
                            iVar12 = (p->vCubesS).nSize;
                          }
                          if (0 < iVar12) {
                            lVar22 = 0;
                            do {
                              Fxch_TabDoubleDivisors(p,(p->vCubesS).pArray[lVar22] >> 8,1);
                              lVar22 = lVar22 + 1;
                            } while (lVar22 < (p->vCubesS).nSize);
                            iVar13 = (p->vCubesD).nSize;
                          }
                          if (1 < iVar13) {
                            lVar22 = 0;
                            do {
                              Fxch_TabDoubleDivisors(p,(p->vCubesD).pArray[lVar22] >> 8,1);
                              iVar12 = (int)lVar22;
                              lVar22 = lVar22 + 2;
                            } while (iVar12 + 3 < (p->vCubesD).nSize);
                          }
                          return;
                        }
                      }
                      goto LAB_0035b7a0;
                    }
                  }
                }
              }
            }
LAB_0035b7fd:
            __assert_fail("p->nSize >= nSizeNew",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
          }
LAB_0035b7a0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                        ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
      }
      __assert_fail("Lit0 >= 0 && Lit1 >= 0 && Lit0 < Lit1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                    ,0x276,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

void Fxch_ManUpdate( Fxch_Man_t * p, int iDiv )
{
    Vec_Int_t * vCube1, * vCube2, * vLitP, * vLitN;
    //int nLitsNew = p->nLits - (int)Vec_FltEntry(&p->vWeights, iDiv);
    int i, Lit0, Lit1, hCube1, hCube2, iVarNew;
    //float Diff = Vec_FltEntry(&p->vWeights, iDiv) - (float)((int)Vec_FltEntry(&p->vWeights, iDiv));
    //assert( Diff > 0.0 && Diff < 1.0 );

    // get the divisor and select pivot variables
    Vec_IntPush( &p->vRands, Gia_ManRandom(0) & 0x3FFFFFF ); 
    Vec_IntPush( &p->vRands, Gia_ManRandom(0) & 0x3FFFFFF );
    Lit0 = Hash_IntObjData0( p->vHash, iDiv );
    Lit1 = Hash_IntObjData1( p->vHash, iDiv );
    assert( Lit0 >= 0 && Lit1 >= 0 && Lit0 < Lit1 );
    Vec_WrdPush( &p->vDivs, ((word)Lit1 << 32) | (word)Lit0 );

    // if the input cover is not prime, it may happen that we are extracting divisor (x + !x)
    // although it is not strictly correct, it seems to be fine to just skip such divisors
//    if ( Abc_Lit2Var(Lit0) == Abc_Lit2Var(Lit1) && Vec_IntSize(Hsh_VecReadEntry(p->vHash, iDiv)) == 2 )
//        return;

    // collect single-cube-divisor cubes
    vLitP = Vec_WecEntry(&p->vLits, Lit0);
    vLitN = Vec_WecEntry(&p->vLits, Lit1);
    Fxch_CompressCubes( p, vLitP );
    Fxch_CompressCubes( p, vLitN );
//    Fxch_CollectSingles( vLitP, vLitN, &p->vCubesS );
//    assert( Vec_IntSize(&p->vCubesS) % 2 == 0 );
    Vec_IntTwoRemoveCommon( vLitP, vLitN, &p->vCubesS );
    Fxch_FilterCubes( p, &p->vCubesS, Lit0, Lit1 );

    // collect double-cube-divisor cube pairs
    Fxch_CollectDoubles( p, Vec_WecEntry(&p->vPairs, iDiv), &p->vCubesD, Abc_LitNot(Lit0), Abc_LitNot(Lit1) );
    assert( Vec_IntSize(&p->vCubesD) % 2 == 0 );
    Vec_IntUniqifyPairs( &p->vCubesD );
    assert( Vec_IntSize(&p->vCubesD) % 2 == 0 );

    // subtract cost of single-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 0 );  // remove - update
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 0 ),  // remove - update
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube2), 0 );  // remove - update

    // subtract cost of double-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
    {
        //printf( "%d ", Pla_CubeNum(hCube1) );
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 0 );  // remove - update
    }
    //printf( "\n" );

    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
    {
        //printf( "%d ", Pla_CubeNum(hCube1) );
        //printf( "%d  ", Pla_CubeNum(hCube2) );
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 0 ),  // remove - update
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube2), 0 );  // remove - update
    }
    //printf( "\n" );

    // create new literals
    p->nLits += 2;
    iVarNew = Vec_WecSize( &p->vLits ) / 2;
    vLitP = Vec_WecPushLevel( &p->vLits );
    vLitN = Vec_WecPushLevel( &p->vLits );
    vLitP = Vec_WecEntry( &p->vLits, Vec_WecSize(&p->vLits) - 2 );
    // update single-cube divisor cubes
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
    {
//        int Lit0s, Lit1s;
        vCube1 = Fxch_ManCube( p, hCube1 );
//        Lit0s = Vec_IntEntry(vCube1, Pla_CubeLit(hCube1));
//        Lit1s = Vec_IntEntry(vCube1, Pla_CubeLit(hCube2));
//        assert( Pla_CubeNum(hCube1) == Pla_CubeNum(hCube2) );
//        assert( Vec_IntEntry(vCube1, Pla_CubeLit(hCube1)) == Lit0 );
//        assert( Vec_IntEntry(vCube1, Pla_CubeLit(hCube2)) == Lit1 );
        Fxch_CompressLiterals( vCube1, Lit0, Lit1 );
//        Vec_IntPush( vLitP, Pla_CubeHandle(Pla_CubeNum(hCube1), Vec_IntSize(vCube1)) );
        Vec_IntPush( vLitP, Pla_CubeNum(hCube1) );
        Vec_IntPush( vCube1, Abc_Var2Lit(iVarNew, 0) );

        //if ( Pla_CubeNum(hCube1) == 3 )
        //    printf( "VecSize = %d\n", Vec_IntSize(vCube1) );

        p->nLits--;
    }
    // update double-cube divisor cube pairs
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
    {
        vCube1 = Fxch_ManCube( p, hCube1 );
        vCube2 = Fxch_ManCube( p, hCube2 );
        assert( Vec_IntEntry(vCube1, Pla_CubeLit(hCube1)) == Abc_LitNot(Lit0) );
        assert( Vec_IntEntry(vCube2, Pla_CubeLit(hCube2)) == Abc_LitNot(Lit1) );
        Fxch_CompressLiterals2( vCube1, Pla_CubeLit(hCube1), -1 );
//        Vec_IntPush( vLitN, Pla_CubeHandle(Pla_CubeNum(hCube1), Vec_IntSize(vCube1)) );
        Vec_IntPush( vLitN, Pla_CubeNum(hCube1) );
        Vec_IntPush( vCube1, Abc_Var2Lit(iVarNew, 1) );
        p->nLits -= Vec_IntSize(vCube2);

        //if ( Pla_CubeNum(hCube1) == 3 )
        //    printf( "VecSize = %d\n", Vec_IntSize(vCube1) );

        // remove second cube
        Vec_IntClear( vCube2 ); 
    }
    Vec_IntSort( vLitN, 0 );
    Vec_IntSort( vLitP, 0 );

    // add cost of single-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
        Fxch_TabSingleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update

    // add cost of double-cube divisors
//    Vec_IntForEachEntryDouble( &p->vCubesS, hCube1, hCube2, i )
    Vec_IntForEachEntry( &p->vCubesS, hCube1, i )
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update
    Vec_IntForEachEntryDouble( &p->vCubesD, hCube1, hCube2, i )
        Fxch_TabDoubleDivisors( p, Pla_CubeNum(hCube1), 1 );  // add - update
    
    // check predicted improvement: (new SOP lits == old SOP lits - divisor weight)
    //assert( p->nLits == nLitsNew );
}